

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_withSmallPrefix
              (char *source,char *dest,int compressedSize,int maxOutputSize,size_t prefixSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  byte *pbVar3;
  byte bVar4;
  BYTE BVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  U32 length;
  uint uVar9;
  BYTE *pBVar10;
  ushort *puVar11;
  long lVar12;
  ushort *puVar13;
  BYTE *pBVar14;
  ushort *puVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  uint uVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  ulong uVar21;
  int iVar22;
  BYTE *s;
  ushort *puVar23;
  ushort *__src;
  ulong uVar24;
  BYTE *d;
  ulong uVar25;
  BYTE *dstEnd;
  
  iVar22 = -1;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar22 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pBVar14 = (BYTE *)(dest + -prefixSize);
      puVar1 = (ushort *)(source + compressedSize);
      pBVar2 = (BYTE *)(dest + maxOutputSize);
      puVar13 = (ushort *)source;
      dstEnd = (BYTE *)dest;
      if (maxOutputSize < 0x40) goto LAB_001130a5;
LAB_00112e0d:
      __src = (ushort *)((long)puVar13 + 1);
      bVar4 = (byte)*puVar13;
      uVar24 = (ulong)(uint)(bVar4 >> 4);
      if (bVar4 >> 4 == 0xf) {
        if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00113024;
        puVar15 = puVar13 + 1;
        uVar18 = 0;
        puVar13 = puVar13 + 8;
        do {
          puVar23 = __src;
          puVar11 = puVar13;
          __src = (ushort *)((long)puVar23 + 1);
          uVar18 = uVar18 + *(byte *)((long)puVar11 + -0xf);
          puVar15 = (ushort *)((long)puVar15 + 1);
          puVar13 = (ushort *)((long)puVar11 + 1);
        } while (puVar11 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                 *(byte *)((long)puVar11 + -0xf) == 0xff);
        uVar24 = (ulong)uVar18 + 0xf;
        pBVar19 = dstEnd + uVar24;
        if ((CARRY8((ulong)dstEnd,uVar24)) || ((ulong)-(long)puVar15 < uVar24)) {
          __src = puVar11 + -7;
          goto LAB_00113024;
        }
        uVar9 = (uint)bVar4;
        if (dest + (long)maxOutputSize + -0x20 < pBVar19) goto LAB_0011311c;
        puVar13 = (ushort *)((ulong)uVar18 + (long)puVar11 + 1);
        if (puVar1 + -0x10 < puVar13) {
          __src = puVar11 + -7;
          uVar9 = (uint)bVar4;
          goto LAB_0011311c;
        }
        lVar12 = 0;
        do {
          uVar7 = *(undefined8 *)((byte *)((long)__src + lVar12) + 8);
          pBVar16 = dstEnd + lVar12;
          *(undefined8 *)pBVar16 = *(undefined8 *)((long)__src + lVar12);
          *(undefined8 *)(pBVar16 + 8) = uVar7;
          pbVar3 = (byte *)((long)puVar23 + lVar12 + 0x11);
          uVar7 = *(undefined8 *)(pbVar3 + 8);
          *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)pbVar3;
          *(undefined8 *)(pBVar16 + 0x18) = uVar7;
          lVar12 = lVar12 + 0x20;
        } while (pBVar16 + 0x20 < pBVar19);
      }
      else {
        pBVar19 = dstEnd + uVar24;
        uVar9 = (uint)bVar4;
        if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_0011311c;
        uVar7 = *(undefined8 *)((long)puVar13 + 9);
        *(undefined8 *)dstEnd = *(undefined8 *)__src;
        *(undefined8 *)(dstEnd + 8) = uVar7;
        puVar13 = (ushort *)(uVar24 + (long)__src);
      }
      uVar6 = *puVar13;
      uVar24 = (ulong)uVar6;
      puVar13 = puVar13 + 1;
      pBVar16 = pBVar19 + -uVar24;
      uVar25 = (ulong)(bVar4 & 0xf);
      if (uVar25 == 0xf) {
        __src = puVar13;
        if (pBVar16 < pBVar14) goto LAB_00113024;
        uVar9 = 0;
        puVar15 = puVar13;
        do {
          puVar13 = (ushort *)((long)puVar15 + 1);
          __src = puVar13;
          if (puVar1 + -2 <= puVar13) goto LAB_00113024;
          uVar8 = *puVar15;
          uVar9 = uVar9 + (byte)uVar8;
          puVar15 = puVar13;
        } while ((byte)uVar8 == 0xff);
        uVar21 = (ulong)uVar9;
        if ((BYTE *)(-uVar21 - 0x10) < pBVar19) goto LAB_00113024;
        uVar25 = uVar21 + 0x13;
        if (pBVar2 + -0x40 <= pBVar19 + uVar21 + 0x13) goto LAB_001131d2;
LAB_00112f95:
        __src = puVar13;
        if (pBVar16 < pBVar14) goto LAB_00113024;
        dstEnd = pBVar19 + uVar25;
        if (uVar6 < 0x10) {
          LZ4_memcpy_using_offset(pBVar19,pBVar16,dstEnd,uVar24);
        }
        else {
          do {
            uVar7 = *(undefined8 *)(pBVar19 + -uVar24 + 8);
            *(undefined8 *)pBVar19 = *(undefined8 *)(pBVar19 + -uVar24);
            *(undefined8 *)(pBVar19 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pBVar19 + -uVar24 + 0x10 + 8);
            *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(pBVar19 + -uVar24 + 0x10);
            *(undefined8 *)(pBVar19 + 0x18) = uVar7;
            pBVar19 = pBVar19 + 0x20;
          } while (pBVar19 < dstEnd);
        }
      }
      else {
        dstEnd = pBVar19 + uVar25 + 4;
        uVar25 = uVar25 + 4;
        if (pBVar2 + -0x40 <= dstEnd) goto LAB_001131d2;
        if ((pBVar16 < pBVar14) || (uVar6 < 8)) goto LAB_00112f95;
        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar16;
        *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar16 + 8);
        *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
      }
      goto LAB_00112e0d;
    }
  }
  return iVar22;
LAB_001131d2:
  __src = puVar13;
  if (pBVar16 < pBVar14) {
LAB_00113024:
    return ~(uint)__src + (int)source;
  }
  dstEnd = pBVar19 + uVar25;
  if ((uint)uVar24 < 8) {
    pBVar19[0] = '\0';
    pBVar19[1] = '\0';
    pBVar19[2] = '\0';
    pBVar19[3] = '\0';
    *pBVar19 = *pBVar16;
    pBVar19[1] = pBVar16[1];
    pBVar19[2] = pBVar16[2];
    pBVar19[3] = pBVar16[3];
    uVar24 = (ulong)((uint)uVar24 << 2);
    uVar21 = (ulong)*(uint *)((long)inc32table + uVar24);
    *(undefined4 *)(pBVar19 + 4) = *(undefined4 *)(pBVar16 + uVar21);
    pBVar16 = pBVar16 + (uVar21 - (long)*(int *)((long)dec64table + uVar24));
  }
  else {
    *(undefined8 *)pBVar19 = *(undefined8 *)pBVar16;
    pBVar16 = pBVar16 + 8;
  }
  pBVar10 = pBVar19 + 8;
  if (pBVar2 + -0xc < dstEnd) {
    if (pBVar2 + -5 < dstEnd) goto LAB_00113024;
    pBVar19 = pBVar2 + -7;
    pBVar17 = pBVar16;
    pBVar20 = pBVar10;
    if (pBVar10 < pBVar19) {
      do {
        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar17;
        pBVar20 = pBVar20 + 8;
        pBVar17 = pBVar17 + 8;
      } while (pBVar20 < pBVar19);
      pBVar16 = pBVar16 + ((long)pBVar19 - (long)pBVar10);
      pBVar10 = pBVar19;
    }
    for (; pBVar10 < dstEnd; pBVar10 = pBVar10 + 1) {
      BVar5 = *pBVar16;
      pBVar16 = pBVar16 + 1;
      *pBVar10 = BVar5;
    }
  }
  else {
    *(undefined8 *)pBVar10 = *(undefined8 *)pBVar16;
    if (0x10 < uVar25) {
      pBVar19 = pBVar19 + 0x10;
      do {
        pBVar16 = pBVar16 + 8;
        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar16;
        pBVar19 = pBVar19 + 8;
      } while (pBVar19 < dstEnd);
    }
  }
LAB_001130a5:
  while( true ) {
    __src = (ushort *)((long)puVar13 + 1);
    bVar4 = (byte)*puVar13;
    uVar24 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= __src) ||
       (dest + (long)maxOutputSize + -0x20 < dstEnd)) goto LAB_00113118;
    uVar7 = *(undefined8 *)((long)puVar13 + 9);
    *(undefined8 *)dstEnd = *(undefined8 *)__src;
    *(undefined8 *)(dstEnd + 8) = uVar7;
    pBVar19 = dstEnd + uVar24;
    uVar25 = (ulong)(bVar4 & 0xf);
    puVar13 = (ushort *)((long)__src + uVar24) + 1;
    uVar6 = *(ushort *)((long)__src + uVar24);
    uVar24 = (ulong)uVar6;
    pBVar16 = pBVar19 + -uVar24;
    if (((uVar25 == 0xf) || (uVar6 < 8)) || (pBVar16 < pBVar14)) goto LAB_0011316e;
    *(undefined8 *)pBVar19 = *(undefined8 *)pBVar16;
    *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar16 + 8);
    *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
    dstEnd = pBVar19 + uVar25 + 4;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00113024;
  puVar13 = puVar13 + 1;
  uVar9 = 0;
  do {
    uVar6 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar9 = uVar9 + (byte)uVar6;
    puVar13 = (ushort *)((long)puVar13 + 1);
  } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
  uVar24 = (ulong)uVar9 + 0xf;
  if ((CARRY8((ulong)dstEnd,uVar24)) || ((ulong)-(long)puVar13 < uVar24)) goto LAB_00113024;
LAB_00113118:
  pBVar19 = dstEnd + uVar24;
  uVar9 = (uint)bVar4;
LAB_0011311c:
  puVar13 = (ushort *)((long)__src + uVar24);
  if ((pBVar2 + -0xc < pBVar19) || (puVar1 + -4 < puVar13)) {
    if ((puVar13 == puVar1) && (pBVar19 <= pBVar2)) {
      memmove(dstEnd,__src,uVar24);
      return ((int)dstEnd + (int)uVar24) - (int)dest;
    }
    goto LAB_00113024;
  }
  do {
    *(undefined8 *)dstEnd = *(undefined8 *)__src;
    dstEnd = dstEnd + 8;
    __src = __src + 4;
  } while (dstEnd < pBVar19);
  uVar24 = (ulong)*puVar13;
  puVar13 = puVar13 + 1;
  pBVar16 = pBVar19 + -uVar24;
  uVar25 = (ulong)(uVar9 & 0xf);
LAB_0011316e:
  if ((int)uVar25 == 0xf) {
    uVar9 = 0;
    do {
      uVar6 = *puVar13;
      puVar13 = (ushort *)((long)puVar13 + 1);
      uVar9 = uVar9 + (byte)uVar6;
    } while ((byte)uVar6 == 0xff && puVar13 < puVar1 + -2);
    uVar25 = (ulong)uVar9 + 0xf;
    __src = puVar13;
    if ((puVar1 + -2 <= puVar13) || (CARRY8((ulong)pBVar19,uVar25))) goto LAB_00113024;
  }
  uVar25 = uVar25 + 4;
  goto LAB_001131d2;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
static int LZ4_decompress_safe_withSmallPrefix(const char* source, char* dest, int compressedSize, int maxOutputSize,
                                               size_t prefixSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest-prefixSize, NULL, 0);
}